

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlib.c
# Opt level: O2

void cxpose(float *indata,long iRsiz,float *outdata,long oRsiz,long Nrows,long Ncols)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  float *pfVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  pfVar2 = outdata + 6;
  for (lVar1 = Nrows / 4; lVar4 = Ncols, pfVar3 = indata, pfVar5 = pfVar2, 0 < lVar1;
      lVar1 = lVar1 + -1) {
    while (0 < lVar4) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)pfVar3;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)(pfVar3 + iRsiz * 4);
      auVar6 = vmovhps_avx(auVar6,*(undefined8 *)(pfVar3 + iRsiz * 2));
      auVar7 = vmovhps_avx(auVar7,*(undefined8 *)(pfVar3 + iRsiz * 6));
      *(undefined1 (*) [16])(pfVar5 + -6) = auVar6;
      *(undefined1 (*) [16])(pfVar5 + -2) = auVar7;
      lVar4 = lVar4 + -1;
      pfVar3 = pfVar3 + 2;
      pfVar5 = pfVar5 + oRsiz * 2;
    }
    indata = indata + iRsiz * 8;
    outdata = outdata + 8;
    pfVar2 = pfVar2 + 8;
  }
  if (Nrows % 4 != 0) {
    for (; pfVar2 = indata, lVar1 = Nrows % 4, pfVar3 = outdata, 0 < Ncols; Ncols = Ncols + -1) {
      for (; 0 < lVar1; lVar1 = lVar1 + -1) {
        *(ulong *)pfVar3 = *(ulong *)pfVar2;
        pfVar2 = pfVar2 + iRsiz * 2;
        pfVar3 = pfVar3 + 2;
      }
      indata = indata + 2;
      outdata = outdata + oRsiz * 2;
    }
  }
  return;
}

Assistant:

void cxpose(float *indata, long iRsiz, float *outdata, long oRsiz, long Nrows, long Ncols){
/* not in-place complex float matrix transpose	*/
/* INPUTS */
/* *indata = input data array	*/
/* iRsiz = offset to between rows of input data array	*/
/* oRsiz = offset to between rows of output data array	*/
/* Nrows = number of rows in input data array	*/
/* Ncols = number of columns in input data array	*/
/* OUTPUTS */
/* *outdata = output data array	*/

float	*irow; 		/* pointer to input row start */
float	*ocol; 		/* pointer to output col start */
float	*idata; 	/* pointer to input data */
float	*odata; 	/* pointer to output data */
long 	RowCnt;		/* row counter */
long 	ColCnt;		/* col counter */
float	T0r; 		/* data storage */
float	T0i; 		/* data storage */
float	T1r; 		/* data storage */
float	T1i; 		/* data storage */
float	T2r; 		/* data storage */
float	T2i; 		/* data storage */
float	T3r; 		/* data storage */
float	T3i; 		/* data storage */
const long inRsizd1 = 2*iRsiz;
const long inRsizd1i = 2*iRsiz + 1;
const long inRsizd2 = 4*iRsiz;
const long inRsizd2i = 4*iRsiz + 1;
const long inRsizd3 = inRsizd2+inRsizd1;
const long inRsizd3i = inRsizd2+inRsizd1 + 1;
const long inRsizd4 = 8*iRsiz;

ocol = outdata;
irow = indata;
for (RowCnt=Nrows/4; RowCnt>0; RowCnt--){
	idata = irow;
	odata = ocol;
	for (ColCnt=Ncols; ColCnt>0; ColCnt--){
		T0r = *idata;
		T0i = *(idata +1);
		T1r = *(idata+inRsizd1);
		T1i = *(idata+inRsizd1i);
		T2r = *(idata+inRsizd2);
		T2i = *(idata+inRsizd2i);
		T3r = *(idata+inRsizd3);
		T3i = *(idata+inRsizd3i);
		*odata = T0r;
		*(odata+1) = T0i;
		*(odata+2) = T1r;
		*(odata+3) = T1i;
		*(odata+4) = T2r;
		*(odata+5) = T2i;
		*(odata+6) = T3r;
		*(odata+7) = T3i;
		idata+=2;
		odata += 2*oRsiz;
	}
	irow += inRsizd4;
	ocol += 8;
}
if (Nrows%4 != 0){
	for (ColCnt=Ncols; ColCnt>0; ColCnt--){
		idata = irow;
		odata = ocol;
		for (RowCnt=Nrows%4; RowCnt>0; RowCnt--){
			T0r = *idata;
			T0i = *(idata+1);
			*odata = T0r;
			*(odata+1) = T0i;
			odata+=2;
			idata += 2*iRsiz;
		}
		irow+=2;
		ocol += 2*oRsiz;
	}
}
}